

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_verify.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_md_info_t *md_info;
  char local_7a8 [8];
  char filename [512];
  uchar buf [1024];
  uchar hash [32];
  mbedtls_rsa_context rsa;
  size_t i;
  undefined1 local_28 [4];
  int exit_code;
  int c;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  exit_code = 1;
  i._4_4_ = 1;
  f = (FILE *)argv;
  argv_local._0_4_ = argc;
  mbedtls_rsa_init((mbedtls_rsa_context *)(hash + 0x18),0,0);
  if ((int)argv_local == 2) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    _c = fopen("rsa_pub.txt","rb");
    if (_c == (FILE *)0x0) {
      printf(" failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      exit_code = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.len,0x10,(FILE *)_c);
      if ((exit_code == 0) &&
         (exit_code = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)_c), exit_code == 0
         )) {
        sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)&rsa.len);
        rsa._0_8_ = sVar3 + 7 >> 3;
        fclose(_c);
        snprintf(local_7a8,0x200,"%s.sig",f->_IO_read_ptr);
        _c = fopen(local_7a8,"rb");
        if (_c == (FILE *)0x0) {
          printf("\n  ! Could not open %s\n\n",local_7a8);
        }
        else {
          rsa.padding = 0;
          rsa.hash_id = 0;
          while (iVar2 = __isoc99_fscanf(_c,"%02X",local_28),
                0 < iVar2 && (ulong)rsa._328_8_ < 0x400) {
            lVar1 = rsa._328_8_ + 0x1f8;
            rsa._328_8_ = rsa._328_8_ + 1;
            filename[lVar1] = local_28[0];
          }
          fclose(_c);
          if (rsa._328_8_ == rsa._0_8_) {
            printf("\n  . Verifying the RSA/SHA-256 signature");
            fflush(_stdout);
            md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
            exit_code = mbedtls_md_file(md_info,f->_IO_read_ptr,buf + 0x3f8);
            if (exit_code == 0) {
              exit_code = mbedtls_rsa_pkcs1_verify
                                    ((mbedtls_rsa_context *)(hash + 0x18),
                                     (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,
                                     MBEDTLS_MD_SHA256,0x14,buf + 0x3f8,(uchar *)(filename + 0x1f8))
              ;
              if (exit_code == 0) {
                printf("\n  . OK (the signature is valid)\n\n");
                i._4_4_ = 0;
              }
              else {
                printf(" failed\n  ! mbedtls_rsa_pkcs1_verify returned -0x%0x\n\n",
                       (ulong)(uint)-exit_code);
              }
            }
            else {
              printf(" failed\n  ! Could not open or read %s\n\n",f->_IO_read_ptr);
            }
          }
          else {
            printf("\n  ! Invalid RSA signature format\n\n");
          }
        }
      }
      else {
        printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)(uint)exit_code);
        fclose(_c);
      }
    }
  }
  else {
    printf("usage: rsa_verify <filename>\n");
  }
  mbedtls_rsa_free((mbedtls_rsa_context *)(hash + 0x18));
  return i._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1, c;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i;
    mbedtls_rsa_context rsa;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_verify <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * Extract the RSA signature from the text file
     */
    mbedtls_snprintf( filename, sizeof(filename), "%s.sig", argv[1] );

    if( ( f = fopen( filename, "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", filename );
        goto exit;
    }

    i = 0;
    while( fscanf( f, "%02X", &c ) > 0 &&
           i < (int) sizeof( buf ) )
        buf[i++] = (unsigned char) c;

    fclose( f );

    if( i != rsa.len )
    {
        mbedtls_printf( "\n  ! Invalid RSA signature format\n\n" );
        goto exit;
    }

    /*
     * Compute the SHA-256 hash of the input file and
     * verify the signature
     */
    mbedtls_printf( "\n  . Verifying the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[1], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[1] );
        goto exit;
    }

    if( ( ret = mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL, MBEDTLS_RSA_PUBLIC,
                                  MBEDTLS_MD_SHA256, 20, hash, buf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_verify returned -0x%0x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK (the signature is valid)\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}